

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
pbrt::Image::Image(Image *this,
                  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *p16c,
                  Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels)

{
  memory_resource *pmVar1;
  int vb;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *local_40;
  size_t va;
  
  this->format = Half;
  (this->resolution).super_Tuple2<pbrt::Point2,_int> = resolution.super_Tuple2<pbrt::Point2,_int>;
  local_40 = p16c;
  va = (size_t)pstd::pmr::new_delete_resource();
  local_48 = &this->channelNames;
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            ((InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
              *)&this->channelNames,channels.ptr,channels.ptr + channels.n,
             (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&va);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->p8).alloc.memoryResource = pmVar1;
  (this->p8).nStored = 0;
  (this->p8).ptr = (uchar *)0x0;
  (this->p8).nAlloc = 0;
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
            (&this->p16,local_40);
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->p32).alloc.memoryResource = pmVar1;
  (this->p32).nStored = 0;
  (this->p32).ptr = (float *)0x0;
  (this->p32).nAlloc = 0;
  va = (this->p16).nStored;
  vb = resolution.super_Tuple2<pbrt::Point2,_int>.y * resolution.super_Tuple2<pbrt::Point2,_int>.x *
       (int)(this->channelNames).nStored;
  if (va != (long)vb) {
    LogFatal<char_const(&)[11],char_const(&)[44],char_const(&)[11],unsigned_long&,char_const(&)[44],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x1dd,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"p16.size()",
               (char (*) [44])"NChannels() * resolution[0] * resolution[1]",
               (char (*) [11])"p16.size()",(unsigned_long *)&va,
               (char (*) [44])"NChannels() * resolution[0] * resolution[1]",&vb);
  }
  if (this->format == Half) {
    return;
  }
  LogFatal<char_const(&)[16]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x1de,"Check failed: %s",(char (*) [16])"Is16Bit(format)");
}

Assistant:

Image::Image(pstd::vector<Half> p16c, Point2i resolution,
             pstd::span<const std::string> channels)
    : format(PixelFormat::Half),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      p16(std::move(p16c)) {
    CHECK_EQ(p16.size(), NChannels() * resolution[0] * resolution[1]);
    CHECK(Is16Bit(format));
}